

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

bool dg::vr::RelationsAnalyzer::operandsEqual(ValueRelations *graph,I fst,I snd,bool sameOrder)

{
  bool bVar1;
  uint uVar2;
  Relations RVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar7 = *(uint *)(fst + 0x14) & 0x7ffffff;
  uVar8 = (ulong)uVar7;
  if (uVar7 == (*(uint *)(snd + 0x14) & 0x7ffffff)) {
    if (uVar7 == 0) {
      bVar1 = true;
    }
    else {
      lVar6 = 0;
      uVar7 = 0;
      do {
        uVar8 = uVar8 - 1;
        uVar2 = (uint)uVar8;
        if (sameOrder) {
          uVar2 = uVar7;
        }
        if ((*(uint *)(fst + 0x14) >> 0x1e & 1) == 0) {
          lVar4 = (long)fst - (ulong)(*(uint *)(fst + 0x14) << 5);
        }
        else {
          lVar4 = *(long *)(fst + -8);
        }
        if ((*(uint *)(snd + 0x14) >> 0x1e & 1) == 0) {
          lVar5 = (long)snd - (ulong)(*(uint *)(snd + 0x14) << 5);
        }
        else {
          lVar5 = *(long *)(snd + -8);
        }
        RVar3 = ValueRelations::_between
                          (graph,*(V *)(lVar4 + lVar6),*(V *)(lVar5 + (ulong)uVar2 * 0x20));
        bVar1 = (bool)((byte)RVar3.bits.super__Base_bitset<1UL>._M_w & 1);
        if (((ulong)RVar3.bits.super__Base_bitset<1UL>._M_w & 1) == 0) {
          return bVar1;
        }
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x20;
      } while (uVar8 != 0);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RelationsAnalyzer::operandsEqual(
        ValueRelations &graph, I fst, I snd,
        bool sameOrder) { // false means checking in reverse order
    unsigned total = fst->getNumOperands();
    if (total != snd->getNumOperands())
        return false;

    for (unsigned i = 0; i < total; ++i) {
        unsigned otherI = sameOrder ? i : total - i - 1;

        if (!graph.isEqual(fst->getOperand(i), snd->getOperand(otherI)))
            return false;
    }
    return true;
}